

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O3

bool __thiscall crnlib::mip_level::unpack_from_dxt(mip_level *this,bool uncook)

{
  dxt_image *pdVar1;
  image_u8 *p;
  
  pdVar1 = this->m_pDXTImage;
  if (pdVar1 != (dxt_image *)0x0) {
    p = (image_u8 *)crnlib_malloc(0x30);
    p->m_width = 0;
    p->m_height = 0;
    p->m_pitch = 0;
    p->m_total = 0;
    p->m_comp_flags = 0xf;
    p->m_pPixels = (color_quad<unsigned_char,_int> *)0x0;
    (p->m_pixel_buf).m_p = (color_quad<unsigned_char,_int> *)0x0;
    (p->m_pixel_buf).m_size = 0;
    (p->m_pixel_buf).m_capacity = 0;
    assign(this,p,PIXEL_FMT_INVALID,this->m_orient_flags);
  }
  return pdVar1 != (dxt_image *)0x0;
}

Assistant:

bool mip_level::unpack_from_dxt(bool uncook) {
  if (!m_pDXTImage)
    return false;

  image_u8* pNew_img = crnlib_new<image_u8>();
  CRNLIB_ASSERT(get_unpacked_image(*pNew_img, uncook ? cUnpackFlagUncook : 0) == pNew_img);

  assign(pNew_img, PIXEL_FMT_INVALID, m_orient_flags);
  return true;
}